

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O3

int cymric_random(cymric_rng *R,void *buffer,int bytes)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  size_t i;
  timezone cateq_z;
  blake2b_state state;
  timezone local_208;
  blake2b_state local_200;
  
  iVar1 = -1;
  if ((((0 < bytes && (buffer != (void *)0x0 && R != (cymric_rng *)0x0)) &&
       (iVar1 = -2, R->internal[0x40] == 'S')) && (R->internal[0x41] == 'E')) &&
     ((R->internal[0x42] == 'E' && (R->internal[0x43] == 'D')))) {
    gettimeofday((timeval *)&local_200,&local_208);
    *(uint *)(R->internal + 0x20) = *(uint *)(R->internal + 0x20) ^ (uint)local_200.h[1];
    lVar4 = syscall(0xba);
    *(uint *)(R->internal + 0x24) = *(uint *)(R->internal + 0x24) ^ (uint)lVar4;
    LOCK();
    UNLOCK();
    uVar2 = (int)m_counter.super___atomic_base<unsigned_int>._M_i + 1;
    m_counter.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         (__atomic_base<unsigned_int>)(m_counter.super___atomic_base<unsigned_int>._M_i + 1)._M_i;
    *(uint *)(R->internal + 0x20) = *(int *)(R->internal + 0x20) + (uVar2 >> 0x13 | uVar2 * 0x2000);
    chacha((chacha_key *)R,(chacha_iv *)(R->internal + 0x20),(uint8_t *)buffer,(uint8_t *)buffer,
           (ulong)(uint)bytes,0xc);
    gettimeofday((timeval *)&local_200,&local_208);
    *(uint *)(R->internal + 0x24) = *(int *)(R->internal + 0x24) + (uint)local_200.h[1];
    iVar3 = blake2b_init(&local_200,'@');
    iVar1 = -3;
    if (iVar3 == 0) {
      iVar3 = blake2b_update(&local_200,(uint8_t *)R,0x40);
      iVar1 = -4;
      if (iVar3 == 0) {
        iVar3 = blake2b_final(&local_200,(uint8_t *)R,'@');
        iVar1 = -5;
        if (iVar3 == 0) {
          iVar1 = 0;
          lVar4 = 0;
          do {
            local_200.buf[lVar4] = '\0';
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x100);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int cymric_random(
    cymric_rng* R,  ///< [in] Generator to use
    void* buffer,   ///< [in, out] Buffer to fill with random bytes
    int bytes       ///< [in] Number of bytes to fill
) {
    static const int CHACHA_ROUNDS = 12;

    // Validate input
    if (!R || !buffer || bytes <= 0)
        return -1;

    // If R was not seeded:
    if (R->internal[64] != 'S' || R->internal[65] != 'E' ||
        R->internal[66] != 'E' || R->internal[67] != 'D') {
        return -2;
    }

    // Use low 32 bytes as a key for ChaCha20
    chacha_key *key = (chacha_key *)R->internal;

    // Use next 8 bytes as an IV for ChaCha20, reserving the top 24 bytes
    chacha_iv *iv = (chacha_iv *)(R->internal + 32);

    // Mix in some fast entropy sources
    uint32_t *iv_mix = (uint32_t *)iv;

#ifdef CYMRIC_CYCLES
    {
        // Mix in initial cycle count
        iv_mix[0] ^= GetCPUCycles();
    }
#endif

#ifndef CYMRIC_UNINIT
    CAT_MEMCLR(buffer, bytes);
#endif

#ifdef CYMRIC_GETTID
    {
        // Mix in thread id
        iv_mix[1] ^= unix_gettid();
    }
#endif

#ifdef CYMRIC_WINTID
    {
        // Mix in thread id
        iv_mix[1] ^= GetCurrentThreadId();
    }
#endif

#ifdef CYMRIC_PTHREADS
    {
        // Mix in pthread self id
        pthread_t myself = pthread_self();
        const uint32_t *words = (const uint32_t *)&myself;
        iv_mix[1] ^= words[0];
        if (sizeof(myself) > 4) {
            iv_mix[0] += words[1];
        }
    }
#endif

#ifdef CYMRIC_COUNTER
    {
        // Mix in incrementing counter
        const uint32_t c0 = get_counter();
        iv_mix[0] += CAT_ROL32(c0, 13);
    }
#endif

    // Note this is "encrypting" the uninitialized buffer with random
    // bytes from the ChaCha20 function.  Valgrind is not going to like
    // this but it is intentional
    chacha(key, iv, (const uint8_t *)buffer, (uint8_t *)buffer, bytes, CHACHA_ROUNDS);

#ifdef CYMRIC_CYCLES
    {
        // Mix in final cycle count
        iv_mix[1] += GetCPUCycles();
    }
#endif

    blake2b_state state;

    // Iterate the hash to erase the ChaCha20 key material
    if (blake2b_init(&state, 64))
        return -3;
    if (blake2b_update(&state, (const uint8_t *)R->internal, 64))
        return -4;
    if (blake2b_final(&state, (uint8_t *)R->internal, 64))
        return -5;

    CAT_SECURE_OBJCLR(state.buf);

    return 0;
}